

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_DEF(Context *ctx)

{
  int regnum;
  undefined8 uVar1;
  ConstantsList *pCVar2;
  char *pcVar3;
  
  if (ctx->instruction_count == 0) {
    if ((ctx->dest_arg).regtype == REG_TYPE_CONST) {
      regnum = (ctx->dest_arg).regnum;
      pCVar2 = (ConstantsList *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (pCVar2 != (ConstantsList *)0x0) {
        (pCVar2->constant).type = MOJOSHADER_UNIFORM_FLOAT;
        (pCVar2->constant).index = 0;
        *(undefined8 *)&(pCVar2->constant).value = 0;
        *(undefined8 *)((long)&(pCVar2->constant).value + 8) = 0;
        pCVar2->next = ctx->constants;
        ctx->constants = pCVar2;
        ctx->constant_count = ctx->constant_count + 1;
        (pCVar2->constant).index = regnum;
        uVar1 = *(undefined8 *)(ctx->dwords + 2);
        *(undefined8 *)&(pCVar2->constant).value = *(undefined8 *)ctx->dwords;
        *(undefined8 *)((long)&(pCVar2->constant).value + 8) = uVar1;
        reglist_insert(ctx,&ctx->defined_registers,REG_TYPE_CONST,regnum);
        return;
      }
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      return;
    }
    pcVar3 = "DEF token using invalid register";
  }
  else {
    pcVar3 = "DEF token must come before any instructions";
  }
  failf(ctx,"%s",pcVar3);
  return;
}

Assistant:

static void state_DEF(Context *ctx)
{
    const RegisterType regtype = ctx->dest_arg.regtype;
    const int regnum = ctx->dest_arg.regnum;

    // !!! FIXME: fail if same register is defined twice.

    if (ctx->instruction_count != 0)
        fail(ctx, "DEF token must come before any instructions");
    else if (regtype != REG_TYPE_CONST)
        fail(ctx, "DEF token using invalid register");
    else
    {
        ConstantsList *item = alloc_constant_listitem(ctx);
        if (item != NULL)
        {
            item->constant.index = regnum;
            item->constant.type = MOJOSHADER_UNIFORM_FLOAT;
            memcpy(item->constant.value.f, ctx->dwords,
                   sizeof (item->constant.value.f));
            set_defined_register(ctx, regtype, regnum);
        } // if
    } // else
}